

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plastic.hpp
# Opt level: O3

void __thiscall PlasticBSDF::PlasticBSDF(PlasticBSDF *this,Json *conf)

{
  float fVar1;
  const_reference j;
  long lVar2;
  undefined **ppuVar3;
  int iVar4;
  undefined8 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  MT19937Sampler sampler;
  undefined **local_13a8 [625];
  undefined8 local_20;
  
  BSDF::BSDF(&this->super_BSDF,conf);
  (this->super_BSDF)._vptr_BSDF = (_func_int **)&PTR_f_0016ab00;
  j = nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>
                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  *)conf,"ior");
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
            (j,(float *)local_13a8);
  *(undefined4 *)&(this->super_BSDF).field_0x24 = local_13a8[0]._0_4_;
  local_13a8[0] = &PTR_get1f_00169f00;
  local_13a8[1] = (undefined **)0x0;
  lVar2 = 2;
  ppuVar3 = (undefined **)0x0;
  do {
    ppuVar3 = (undefined **)
              (ulong)((((uint)((ulong)ppuVar3 >> 0x1e) ^ (uint)ppuVar3) * 0x6c078965 + (int)lVar2) -
                     1);
    local_13a8[lVar2] = ppuVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x271);
  local_20 = 0x270;
  iVar4 = 1000000;
  fVar1 = 0.0;
  do {
    uVar5 = (*(code *)local_13a8[0][5])(local_13a8);
    fVar8 = (float)((ulong)uVar5 >> 0x20);
    fVar8 = (1.0 - (float)uVar5 * (float)uVar5) - fVar8 * fVar8;
    if (fVar8 <= 0.0) {
      fVar8 = 0.0;
    }
    fVar8 = SQRT(fVar8);
    fVar9 = 1.0 / *(float *)&(this->super_BSDF).field_0x24;
    fVar6 = 1.0 - fVar8 * fVar8;
    if (fVar6 <= 0.0) {
      fVar6 = 0.0;
    }
    fVar7 = SQRT(fVar6) / fVar9;
    fVar6 = 1.0;
    if (fVar7 < 1.0) {
      fVar6 = 1.0 - fVar7 * fVar7;
      if (fVar6 < 0.0) {
        fVar6 = sqrtf(fVar6);
      }
      else {
        fVar6 = SQRT(fVar6);
      }
      fVar7 = (fVar9 * fVar8 - fVar6) / (fVar9 * fVar8 + fVar6);
      fVar8 = (fVar8 - fVar9 * fVar6) / (fVar9 * fVar6 + fVar8);
      fVar6 = (fVar8 * fVar8 + fVar7 * fVar7) * 0.5;
    }
    fVar1 = fVar1 + (1.0 - fVar6);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  this->outRatio = fVar1 / 1e+06;
  return;
}

Assistant:

PlasticBSDF(const Json& conf): BSDF(conf)
	{
		IOR = conf["ior"];
		// precompute outRatio
		// here bruteforcing to demonstrate its physical meaning
		// you can optimize by using approximating polynormial
		MT19937Sampler sampler;
		const int nsample = 1000000;
		double energy = 0; // use double here because accumulating process introduces lots of rounding error
		for (int i=0; i<nsample; ++i) {
			vec3f lambert_out = sampler.cosSampleHemisphereSurface();
			energy += 1 - DielectricBRDF::reflectivity(lambert_out.z, 1/IOR);
		}
		outRatio = energy / nsample;
	}